

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O1

void read_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  byte *pbVar1;
  pps_t *__s;
  sps_t *psVar2;
  pointer piVar3;
  byte bVar4;
  uint32_t r;
  byte *pbVar5;
  int **ppiVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  h264_stream_t *h_00;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int **ppiVar19;
  bool bVar20;
  
  pbVar5 = b->p;
  pbVar1 = b->end;
  uVar12 = b->bits_left;
  uVar7 = 0xffffffff;
  iVar13 = 0;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar20 = true;
    if (pbVar5 < pbVar1) {
      bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar13 = iVar13 + -1;
  } while (((bool)(bVar20 & uVar7 < 0x20)) && (pbVar5 < pbVar1));
  iVar11 = 0;
  uVar12 = 0;
  if (iVar13 != -1) {
    iVar8 = -2 - iVar13;
    iVar14 = -3 - iVar13;
    uVar7 = b->bits_left;
    pbVar5 = b->p;
    uVar12 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar16 = 0;
      if (pbVar5 < pbVar1) {
        uVar16 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar12 = uVar12 | uVar16 << ((byte)iVar8 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar14 != -2);
  }
  uVar7 = 0xffffffff;
  iVar13 = ~(-1 << (~(byte)iVar13 & 0x1f)) + uVar12;
  __s = h->pps_table[iVar13];
  h->pps = __s;
  memset(__s,0,0x168);
  __s->pic_parameter_set_id = iVar13;
  pbVar5 = b->p;
  pbVar1 = b->end;
  uVar12 = b->bits_left;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar20 = true;
    if (pbVar5 < pbVar1) {
      bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar20 & uVar7 < 0x20)) && (pbVar5 < pbVar1));
  uVar12 = 0;
  uVar7 = 0;
  if (iVar11 != -1) {
    iVar13 = -2 - iVar11;
    iVar8 = -3 - iVar11;
    uVar16 = b->bits_left;
    pbVar5 = b->p;
    uVar7 = 0;
    do {
      uVar16 = uVar16 - 1;
      b->bits_left = uVar16;
      uVar15 = 0;
      if (pbVar5 < pbVar1) {
        uVar15 = (uint)((*pbVar5 >> (uVar16 & 0x1f) & 1) != 0);
      }
      if (uVar16 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar16 = 8;
      }
      uVar7 = uVar7 | uVar15 << ((byte)iVar13 & 0x1f);
      iVar8 = iVar8 + -1;
      iVar13 = iVar13 + -1;
    } while (iVar8 != -2);
  }
  __s->seq_parameter_set_id = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar7;
  uVar7 = b->bits_left - 1;
  b->bits_left = uVar7;
  pbVar5 = b->p;
  if (pbVar5 < pbVar1) {
    uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
  }
  if (uVar7 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->entropy_coding_mode_flag = uVar12;
  h->info->encoding_type = uVar12;
  uVar7 = b->bits_left - 1;
  b->bits_left = uVar7;
  pbVar5 = b->p;
  uVar12 = 0;
  if (pbVar5 < pbVar1) {
    uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
  }
  if (uVar7 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->bottom_field_pic_order_in_frame_present_flag = uVar12;
  uVar12 = b->bits_left;
  pbVar5 = b->p;
  uVar7 = 0xffffffff;
  iVar13 = 0;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar20 = true;
    if (pbVar5 < pbVar1) {
      bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar13 = iVar13 + -1;
  } while (((bool)(bVar20 & uVar7 < 0x20)) && (pbVar5 < pbVar1));
  if (iVar13 == -1) {
    uVar12 = 0;
  }
  else {
    iVar11 = -2 - iVar13;
    iVar8 = -3 - iVar13;
    uVar7 = b->bits_left;
    pbVar5 = b->p;
    uVar12 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar16 = 0;
      if (pbVar5 < pbVar1) {
        uVar16 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar12 = uVar12 | uVar16 << ((byte)iVar11 & 0x1f);
      iVar8 = iVar8 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar8 != -2);
  }
  uVar16 = 0xffffffff;
  uVar15 = -1 << (~(byte)iVar13 & 0x1f);
  uVar7 = ~uVar15;
  iVar13 = uVar7 + uVar12;
  __s->num_slice_groups_minus1 = iVar13;
  if (iVar13 != 0 && SCARRY4(uVar7,uVar12) == iVar13 < 0) {
    uVar7 = b->bits_left;
    pbVar5 = b->p;
    uVar9 = 0xffffffff;
    iVar13 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar20 = true;
      if (pbVar5 < pbVar1) {
        bVar20 = (*pbVar5 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar9 = uVar9 + 1;
      iVar13 = iVar13 + -1;
    } while (((bool)(bVar20 & uVar9 < 0x20)) && (pbVar5 < pbVar1));
    if (iVar13 == -1) {
      uVar7 = 0;
    }
    else {
      iVar11 = -2 - iVar13;
      iVar8 = -3 - iVar13;
      uVar9 = b->bits_left;
      pbVar5 = b->p;
      uVar7 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar17 = 0;
        if (pbVar5 < pbVar1) {
          uVar17 = (uint)((*pbVar5 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar7 = uVar7 | uVar17 << ((byte)iVar11 & 0x1f);
        iVar8 = iVar8 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar8 != -2);
    }
    iVar13 = ~(-1 << (~(byte)iVar13 & 0x1f)) + uVar7;
    __s->slice_group_map_type = iVar13;
    switch(iVar13) {
    case 0:
      if (-1 < __s->num_slice_groups_minus1) {
        pbVar5 = b->p;
        lVar10 = 0;
        do {
          uVar12 = b->bits_left;
          uVar7 = 0xffffffff;
          iVar13 = -2;
          do {
            iVar11 = iVar13;
            uVar15 = uVar7;
            uVar12 = uVar12 - 1;
            b->bits_left = uVar12;
            bVar20 = true;
            if (pbVar5 < pbVar1) {
              bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
            }
            if (uVar12 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar12 = 8;
            }
            uVar7 = uVar15 + 1;
          } while (((bool)(bVar20 & uVar7 < 0x20)) && (iVar13 = iVar11 + 1, pbVar5 < pbVar1));
          if (uVar7 == 0) {
            uVar12 = 0;
          }
          else {
            uVar9 = b->bits_left;
            uVar12 = 0;
            do {
              uVar9 = uVar9 - 1;
              b->bits_left = uVar9;
              uVar17 = 0;
              if (pbVar5 < pbVar1) {
                uVar17 = (uint)((*pbVar5 >> (uVar9 & 0x1f) & 1) != 0);
              }
              if (uVar9 == 0) {
                pbVar5 = pbVar5 + 1;
                b->p = pbVar5;
                b->bits_left = 8;
                uVar9 = 8;
              }
              uVar12 = uVar12 | uVar17 << ((byte)uVar15 & 0x1f);
              uVar15 = uVar15 - 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != -2);
          }
          __s->run_length_minus1[lVar10] = ~(-1 << ((byte)uVar7 & 0x1f)) + uVar12;
          bVar20 = lVar10 < __s->num_slice_groups_minus1;
          lVar10 = lVar10 + 1;
        } while (bVar20);
      }
      break;
    case 2:
      if (0 < __s->num_slice_groups_minus1) {
        pbVar5 = b->p;
        lVar10 = 0;
        do {
          uVar7 = b->bits_left;
          uVar12 = 0xffffffff;
          iVar13 = -2;
          do {
            iVar11 = iVar13;
            uVar15 = uVar12;
            uVar7 = uVar7 - 1;
            b->bits_left = uVar7;
            bVar20 = true;
            if (pbVar5 < pbVar1) {
              bVar20 = (*pbVar5 >> (uVar7 & 0x1f) & 1) == 0;
            }
            if (uVar7 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar7 = 8;
            }
            uVar12 = uVar15 + 1;
          } while (((bool)(bVar20 & uVar12 < 0x20)) && (iVar13 = iVar11 + 1, pbVar5 < pbVar1));
          if (uVar12 == 0) {
            uVar7 = 0;
          }
          else {
            uVar9 = b->bits_left;
            uVar7 = 0;
            do {
              uVar9 = uVar9 - 1;
              b->bits_left = uVar9;
              uVar17 = 0;
              if (pbVar5 < pbVar1) {
                uVar17 = (uint)((*pbVar5 >> (uVar9 & 0x1f) & 1) != 0);
              }
              if (uVar9 == 0) {
                pbVar5 = pbVar5 + 1;
                b->p = pbVar5;
                b->bits_left = 8;
                uVar9 = 8;
              }
              uVar7 = uVar7 | uVar17 << ((byte)uVar15 & 0x1f);
              uVar15 = uVar15 - 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != -2);
          }
          __s->top_left[lVar10] = ~(-1 << ((byte)uVar12 & 0x1f)) + uVar7;
          uVar12 = b->bits_left;
          uVar7 = 0xffffffff;
          iVar13 = -2;
          do {
            iVar11 = iVar13;
            uVar15 = uVar7;
            uVar12 = uVar12 - 1;
            b->bits_left = uVar12;
            bVar20 = true;
            if (pbVar5 < pbVar1) {
              bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
            }
            if (uVar12 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar12 = 8;
            }
            uVar7 = uVar15 + 1;
          } while (((bool)(bVar20 & uVar7 < 0x20)) && (iVar13 = iVar11 + 1, pbVar5 < pbVar1));
          if (uVar7 == 0) {
            uVar12 = 0;
          }
          else {
            uVar9 = b->bits_left;
            uVar12 = 0;
            do {
              uVar9 = uVar9 - 1;
              b->bits_left = uVar9;
              uVar17 = 0;
              if (pbVar5 < pbVar1) {
                uVar17 = (uint)((*pbVar5 >> (uVar9 & 0x1f) & 1) != 0);
              }
              if (uVar9 == 0) {
                pbVar5 = pbVar5 + 1;
                b->p = pbVar5;
                b->bits_left = 8;
                uVar9 = 8;
              }
              uVar12 = uVar12 | uVar17 << ((byte)uVar15 & 0x1f);
              uVar15 = uVar15 - 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != -2);
          }
          __s->bottom_right[lVar10] = ~(-1 << ((byte)uVar7 & 0x1f)) + uVar12;
          lVar10 = lVar10 + 1;
        } while (lVar10 < __s->num_slice_groups_minus1);
      }
      break;
    case 3:
    case 4:
    case 5:
      uVar7 = b->bits_left - 1;
      b->bits_left = uVar7;
      pbVar5 = b->p;
      uVar12 = 0;
      if (pbVar5 < pbVar1) {
        uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        b->p = pbVar5 + 1;
        b->bits_left = 8;
      }
      __s->slice_group_change_direction_flag = uVar12;
      uVar12 = b->bits_left;
      pbVar5 = b->p;
      uVar7 = 0xffffffff;
      iVar13 = 0;
      do {
        uVar12 = uVar12 - 1;
        b->bits_left = uVar12;
        bVar20 = true;
        if (pbVar5 < pbVar1) {
          bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
        }
        if (uVar12 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar12 = 8;
        }
        uVar7 = uVar7 + 1;
        iVar13 = iVar13 + -1;
      } while (((bool)(bVar20 & uVar7 < 0x20)) && (pbVar5 < pbVar1));
      if (iVar13 == -1) {
        uVar12 = 0;
      }
      else {
        iVar11 = -2 - iVar13;
        iVar8 = -3 - iVar13;
        uVar7 = b->bits_left;
        pbVar5 = b->p;
        uVar12 = 0;
        do {
          uVar7 = uVar7 - 1;
          b->bits_left = uVar7;
          uVar15 = 0;
          if (pbVar5 < pbVar1) {
            uVar15 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
          }
          if (uVar7 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar7 = 8;
          }
          uVar12 = uVar12 | uVar15 << ((byte)iVar11 & 0x1f);
          iVar8 = iVar8 + -1;
          iVar11 = iVar11 + -1;
        } while (iVar8 != -2);
      }
      __s->slice_group_change_rate_minus1 = ~(-1 << (~(byte)iVar13 & 0x1f)) + uVar12;
      break;
    case 6:
      uVar7 = b->bits_left;
      pbVar5 = b->p;
      uVar9 = 0xffffffff;
      iVar13 = 0;
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        bVar20 = true;
        if (pbVar5 < pbVar1) {
          bVar20 = (*pbVar5 >> (uVar7 & 0x1f) & 1) == 0;
        }
        if (uVar7 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar9 = uVar9 + 1;
        iVar13 = iVar13 + -1;
      } while (((bool)(bVar20 & uVar9 < 0x20)) && (pbVar5 < pbVar1));
      uVar7 = 0;
      if (iVar13 != -1) {
        iVar11 = -2 - iVar13;
        iVar8 = -3 - iVar13;
        uVar9 = b->bits_left;
        pbVar5 = b->p;
        uVar7 = 0;
        do {
          uVar9 = uVar9 - 1;
          b->bits_left = uVar9;
          uVar17 = 0;
          if (pbVar5 < pbVar1) {
            uVar17 = (uint)((*pbVar5 >> (uVar9 & 0x1f) & 1) != 0);
          }
          if (uVar9 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar9 = 8;
          }
          uVar7 = uVar7 | uVar17 << ((byte)iVar11 & 0x1f);
          iVar8 = iVar8 + -1;
          iVar11 = iVar11 + -1;
        } while (iVar8 != -2);
      }
      uVar9 = -1 << (~(byte)iVar13 & 0x1f);
      __s->pic_size_in_map_units_minus1 = ~uVar9 + uVar7;
      uVar12 = uVar12 - uVar15;
      iVar13 = -1;
      uVar15 = 0;
      if (0 < (int)uVar12) {
        uVar15 = uVar12;
      }
      do {
        iVar11 = iVar13;
        iVar13 = iVar11 + 1;
      } while (uVar15 >> ((byte)iVar13 & 0x1f) != 0);
      if (uVar15 != 1 << ((byte)iVar11 & 0x1f)) {
        iVar11 = iVar13;
      }
      iVar8 = 0;
      if (iVar13 != 0) {
        iVar8 = iVar11;
      }
      __s->slice_group_id_bytes = iVar8;
      std::vector<int,_std::allocator<int>_>::resize
                (&__s->slice_group_id,(long)(int)(uVar7 - uVar9));
      if (-1 < __s->pic_size_in_map_units_minus1) {
        piVar3 = (__s->slice_group_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = 0;
        do {
          iVar13 = __s->slice_group_id_bytes;
          uVar12 = 0;
          if (0 < iVar13) {
            pbVar5 = b->p;
            uVar7 = b->bits_left;
            uVar12 = 0;
            do {
              iVar13 = iVar13 + -1;
              uVar7 = uVar7 - 1;
              b->bits_left = uVar7;
              uVar15 = 0;
              if (pbVar5 < b->end) {
                uVar15 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
              }
              if (uVar7 == 0) {
                pbVar5 = pbVar5 + 1;
                b->p = pbVar5;
                b->bits_left = 8;
                uVar7 = 8;
              }
              uVar12 = uVar12 | uVar15 << ((byte)iVar13 & 0x1f);
            } while (iVar13 != 0);
          }
          piVar3[lVar10] = uVar12;
          bVar20 = lVar10 < __s->pic_size_in_map_units_minus1;
          lVar10 = lVar10 + 1;
        } while (bVar20);
      }
    }
  }
  pbVar5 = b->p;
  pbVar1 = b->end;
  uVar12 = b->bits_left;
  iVar13 = 0;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar20 = true;
    if (pbVar5 < pbVar1) {
      bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar16 = uVar16 + 1;
    iVar13 = iVar13 + -1;
  } while (((bool)(bVar20 & uVar16 < 0x20)) && (pbVar5 < pbVar1));
  iVar11 = 0;
  uVar12 = 0;
  if (iVar13 != -1) {
    iVar8 = -2 - iVar13;
    iVar14 = -3 - iVar13;
    uVar7 = b->bits_left;
    pbVar5 = b->p;
    uVar12 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar16 = 0;
      if (pbVar5 < pbVar1) {
        uVar16 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar12 = uVar12 | uVar16 << ((byte)iVar8 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar14 != -2);
  }
  uVar7 = 0xffffffff;
  __s->num_ref_idx_l0_active_minus1 = ~(-1 << (~(byte)iVar13 & 0x1f)) + uVar12;
  uVar12 = b->bits_left;
  pbVar5 = b->p;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar20 = true;
    if (pbVar5 < pbVar1) {
      bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar20 & uVar7 < 0x20)) && (pbVar5 < pbVar1));
  uVar12 = 0;
  uVar7 = 0;
  if (iVar11 != -1) {
    iVar13 = -2 - iVar11;
    iVar8 = -3 - iVar11;
    uVar16 = b->bits_left;
    pbVar5 = b->p;
    uVar7 = 0;
    do {
      uVar16 = uVar16 - 1;
      b->bits_left = uVar16;
      uVar15 = 0;
      if (pbVar5 < pbVar1) {
        uVar15 = (uint)((*pbVar5 >> (uVar16 & 0x1f) & 1) != 0);
      }
      if (uVar16 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar16 = 8;
      }
      uVar7 = uVar7 | uVar15 << ((byte)iVar13 & 0x1f);
      iVar8 = iVar8 + -1;
      iVar13 = iVar13 + -1;
    } while (iVar8 != -2);
  }
  __s->num_ref_idx_l1_active_minus1 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar7;
  uVar7 = b->bits_left - 1;
  b->bits_left = uVar7;
  pbVar5 = b->p;
  if (pbVar5 < pbVar1) {
    uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
  }
  if (uVar7 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->weighted_pred_flag = uVar12;
  uVar12 = b->bits_left;
  pbVar5 = b->p;
  uVar7 = 0;
  iVar13 = 1;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    uVar16 = 0;
    if (pbVar5 < pbVar1) {
      uVar16 = (uint)((*pbVar5 >> (uVar12 & 0x1f) & 1) != 0);
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    bVar4 = (byte)iVar13 & 0x1f;
    uVar7 = uVar7 | uVar16 << bVar4;
    bVar20 = iVar13 != 0;
    iVar13 = iVar13 + -1;
  } while (bVar20);
  __s->weighted_bipred_idc = uVar7;
  uVar12 = b->bits_left;
  pbVar5 = b->p;
  uVar7 = 0xffffffff;
  iVar13 = 0 << bVar4;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar20 = true;
    if (pbVar5 < pbVar1) {
      bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar13 = iVar13 + -1;
  } while (((bool)(bVar20 & uVar7 < 0x20)) && (pbVar5 < pbVar1));
  iVar11 = 0;
  uVar12 = 0;
  if (iVar13 != -1) {
    iVar8 = -2 - iVar13;
    iVar14 = -3 - iVar13;
    uVar7 = b->bits_left;
    pbVar5 = b->p;
    uVar12 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar16 = 0;
      if (pbVar5 < pbVar1) {
        uVar16 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar12 = uVar12 | uVar16 << ((byte)iVar8 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar14 != -2);
  }
  uVar16 = -1 << (~(byte)iVar13 & 0x1f);
  uVar7 = ~uVar16 + uVar12;
  iVar13 = -((int)uVar7 >> 1);
  if ((uVar7 & 1) != 0) {
    iVar13 = (int)(uVar12 - uVar16) >> 1;
  }
  uVar7 = 0xffffffff;
  __s->pic_init_qp_minus26 = iVar13;
  uVar12 = b->bits_left;
  pbVar5 = b->p;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar20 = true;
    if (pbVar5 < pbVar1) {
      bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar20 & uVar7 < 0x20)) && (pbVar5 < pbVar1));
  iVar13 = 0;
  uVar12 = 0;
  if (iVar11 != -1) {
    iVar8 = -2 - iVar11;
    iVar14 = -3 - iVar11;
    uVar7 = b->bits_left;
    pbVar5 = b->p;
    uVar12 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar16 = 0;
      if (pbVar5 < pbVar1) {
        uVar16 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar12 = uVar12 | uVar16 << ((byte)iVar8 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar14 != -2);
  }
  uVar16 = -1 << (~(byte)iVar11 & 0x1f);
  uVar7 = ~uVar16 + uVar12;
  iVar11 = -((int)uVar7 >> 1);
  if ((uVar7 & 1) != 0) {
    iVar11 = (int)(uVar12 - uVar16) >> 1;
  }
  uVar7 = 0xffffffff;
  __s->pic_init_qs_minus26 = iVar11;
  uVar12 = b->bits_left;
  pbVar5 = b->p;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar20 = true;
    if (pbVar5 < pbVar1) {
      bVar20 = (*pbVar5 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar13 = iVar13 + -1;
  } while (((bool)(bVar20 & uVar7 < 0x20)) && (pbVar5 < pbVar1));
  uVar12 = 0;
  uVar7 = 0;
  if (iVar13 != -1) {
    iVar11 = -2 - iVar13;
    iVar8 = -3 - iVar13;
    uVar16 = b->bits_left;
    pbVar5 = b->p;
    uVar7 = 0;
    do {
      uVar16 = uVar16 - 1;
      b->bits_left = uVar16;
      uVar15 = 0;
      if (pbVar5 < pbVar1) {
        uVar15 = (uint)((*pbVar5 >> (uVar16 & 0x1f) & 1) != 0);
      }
      if (uVar16 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar16 = 8;
      }
      uVar7 = uVar7 | uVar15 << ((byte)iVar11 & 0x1f);
      iVar8 = iVar8 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar8 != -2);
  }
  uVar16 = -1 << (~(byte)iVar13 & 0x1f);
  h_00 = (h264_stream_t *)(ulong)uVar16;
  iVar13 = -((int)(~uVar16 + uVar7) >> 1);
  if ((~uVar16 + uVar7 & 1) != 0) {
    iVar13 = (int)(uVar7 - uVar16) >> 1;
  }
  __s->chroma_qp_index_offset = iVar13;
  uVar7 = b->bits_left - 1;
  b->bits_left = uVar7;
  pbVar5 = b->p;
  if (pbVar5 < pbVar1) {
    h_00 = (h264_stream_t *)(ulong)*pbVar5;
    uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
  }
  if (uVar7 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->deblocking_filter_control_present_flag = uVar12;
  uVar7 = b->bits_left - 1;
  b->bits_left = uVar7;
  pbVar5 = b->p;
  uVar12 = 0;
  if (pbVar5 < pbVar1) {
    h_00 = (h264_stream_t *)(ulong)*pbVar5;
    uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
  }
  if (uVar7 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->constrained_intra_pred_flag = uVar12;
  uVar7 = b->bits_left - 1;
  b->bits_left = uVar7;
  pbVar5 = b->p;
  uVar12 = 0;
  if (pbVar5 < pbVar1) {
    h_00 = (h264_stream_t *)(ulong)*pbVar5;
    uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
  }
  if (uVar7 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->redundant_pic_cnt_present_flag = uVar12;
  psVar2 = h->sps;
  uVar12 = psVar2->profile_idc - 0x42;
  if (((uVar12 < 0x17) && ((0x400801U >> (uVar12 & 0x1f) & 1) != 0)) &&
     (((psVar2->constraint_set2_flag << 2 |
       psVar2->constraint_set1_flag * 2 | psVar2->constraint_set0_flag) & 7U) != 0)) {
    iVar13 = 0;
    lVar10 = 0xd0;
  }
  else {
    __s->_more_rbsp_data_present = 1;
    uVar7 = b->bits_left - 1;
    b->bits_left = uVar7;
    pbVar5 = b->p;
    uVar12 = 0;
    if (pbVar5 < pbVar1) {
      uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      b->p = pbVar5 + 1;
      b->bits_left = 8;
    }
    __s->transform_8x8_mode_flag = uVar12;
    uVar7 = b->bits_left - 1;
    b->bits_left = uVar7;
    pbVar5 = b->p;
    uVar12 = 0;
    if (pbVar5 < pbVar1) {
      uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      b->p = pbVar5 + 1;
      b->bits_left = 8;
    }
    __s->pic_scaling_matrix_present_flag = uVar12;
    if ((uVar12 != 0) && (-3 < __s->transform_8x8_mode_flag)) {
      ppiVar19 = __s->ScalingList4x4;
      uVar18 = 0;
      do {
        uVar7 = b->bits_left - 1;
        b->bits_left = uVar7;
        pbVar5 = b->p;
        uVar12 = 0;
        if (pbVar5 < b->end) {
          uVar12 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          b->p = pbVar5 + 1;
          b->bits_left = 8;
        }
        __s->pic_scaling_list_present_flag[uVar18] = uVar12;
        if (uVar12 != 0) {
          ppiVar6 = ppiVar19 + 3;
          if (uVar18 < 6) {
            ppiVar6 = ppiVar19;
          }
          iVar13 = 0x40;
          if (uVar18 < 6) {
            iVar13 = 0x10;
          }
          read_scaling_list(b,*ppiVar6,iVar13,uVar12);
        }
        ppiVar19 = ppiVar19 + 1;
        bVar20 = (long)uVar18 < (long)__s->transform_8x8_mode_flag * 2 + 5;
        uVar18 = uVar18 + 1;
      } while (bVar20);
    }
    pbVar5 = b->p;
    pbVar1 = b->end;
    h_00 = (h264_stream_t *)(ulong)(uint)b->bits_left;
    uVar12 = 0xffffffff;
    iVar13 = 0;
    do {
      uVar7 = (int)h_00 - 1;
      h_00 = (h264_stream_t *)(ulong)uVar7;
      b->bits_left = uVar7;
      bVar20 = true;
      if (pbVar5 < pbVar1) {
        bVar20 = (*pbVar5 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        h_00 = (h264_stream_t *)0x8;
      }
      uVar12 = uVar12 + 1;
      iVar13 = iVar13 + -1;
    } while (((bool)(bVar20 & uVar12 < 0x20)) && (pbVar5 < pbVar1));
    if (iVar13 == -1) {
      uVar12 = 0;
    }
    else {
      iVar11 = -2 - iVar13;
      h_00 = (h264_stream_t *)(ulong)(-iVar13 - 3);
      uVar7 = b->bits_left;
      pbVar5 = b->p;
      uVar12 = 0;
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        uVar16 = 0;
        if (pbVar5 < pbVar1) {
          uVar16 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar12 = uVar12 | uVar16 << ((byte)iVar11 & 0x1f);
        uVar16 = (int)h_00 - 1;
        h_00 = (h264_stream_t *)(ulong)uVar16;
        iVar11 = iVar11 + -1;
      } while (uVar16 != 0xfffffffe);
    }
    uVar16 = -1 << (~(byte)iVar13 & 0x1f);
    uVar7 = ~uVar16 + uVar12;
    iVar13 = -((int)uVar7 >> 1);
    if ((uVar7 & 1) != 0) {
      iVar13 = (int)(uVar12 - uVar16) >> 1;
    }
    lVar10 = 0x160;
  }
  *(int *)((long)__s->run_length_minus1 + lVar10 + -0x1c) = iVar13;
  read_rbsp_trailing_bits(h_00,b);
  return;
}

Assistant:

void read_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    int pps_id = bs_read_ue(b);
    pps_t* pps = h->pps = h->pps_table[pps_id] ;

    memset(pps, 0, sizeof(pps_t));

    int i;
    int i_group;

    pps->pic_parameter_set_id = pps_id;
    pps->seq_parameter_set_id = bs_read_ue(b);
    pps->entropy_coding_mode_flag = bs_read_u1(b);

    // add by Late Lee
    h->info->encoding_type = pps->entropy_coding_mode_flag;

    //2005年版本此处为pps->pic_order_present_flag，2013年版本为bottom_field_pic_order_in_frame_present_flag
    pps->bottom_field_pic_order_in_frame_present_flag = bs_read_u1(b);
    pps->num_slice_groups_minus1 = bs_read_ue(b);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        pps->slice_group_map_type = bs_read_ue(b);
        if( pps->slice_group_map_type == 0 )
        {
            for( i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                pps->run_length_minus1[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                pps->top_left[ i_group ] = bs_read_ue(b);
                pps->bottom_right[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            pps->slice_group_change_direction_flag = bs_read_u1(b);
            pps->slice_group_change_rate_minus1 = bs_read_ue(b);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            pps->pic_size_in_map_units_minus1 = bs_read_ue(b);
            pps->slice_group_id_bytes = intlog2( pps->num_slice_groups_minus1 + 1 );
            pps->slice_group_id.resize(pps->pic_size_in_map_units_minus1 + 1);
            for( i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                pps->slice_group_id[ i ] = bs_read_u(b,  pps->slice_group_id_bytes); // was u(v)
            }
        }
    }
    pps->num_ref_idx_l0_active_minus1 = bs_read_ue(b);
    pps->num_ref_idx_l1_active_minus1 = bs_read_ue(b);
    pps->weighted_pred_flag = bs_read_u1(b);
    pps->weighted_bipred_idc = bs_read_u(b,2);
    pps->pic_init_qp_minus26 = bs_read_se(b);
    pps->pic_init_qs_minus26 = bs_read_se(b);
    pps->chroma_qp_index_offset = bs_read_se(b);
    pps->deblocking_filter_control_present_flag = bs_read_u1(b);
    pps->constrained_intra_pred_flag = bs_read_u1(b);
    pps->redundant_pic_cnt_present_flag = bs_read_u1(b);

    pps->_more_rbsp_data_present = more_rbsp_data_in_pps(h, b);
    if( pps->_more_rbsp_data_present )
    {
        pps->transform_8x8_mode_flag = bs_read_u1(b);
        pps->pic_scaling_matrix_present_flag = bs_read_u1(b);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                pps->pic_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                           pps->UseDefaultScalingMatrix4x4Flag[ i ] );
                    }
                    else
                    {
                        read_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                           pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] );
                    }
                }
            }
        }
        pps->second_chroma_qp_index_offset = bs_read_se(b);
    }
    read_rbsp_trailing_bits(h, b);
}